

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_mac(ssh2_macalg *malg)

{
  ulong uVar1;
  uint32_t uVar2;
  ssh2_mac *m_00;
  void *ptr;
  void *ptr_00;
  size_t sVar3;
  ptrlen key;
  undefined1 local_44 [4];
  uint32_t seq;
  uint8_t seqbuf [4];
  size_t i;
  uint8_t *data;
  size_t maclen;
  size_t datalen;
  uint8_t *mkey;
  ssh2_mac *m;
  ssh2_macalg *malg_local;
  
  m_00 = ssh2_mac_new(malg,(ssh_cipher *)0x0);
  if (m_00 == (ssh2_mac *)0x0) {
    test_skipped = true;
  }
  else {
    ptr = safemalloc((long)malg->keylen,1,0);
    ptr_00 = safemalloc((long)malg->len + 0x100,1,0);
    _seq = 0;
    while( true ) {
      uVar1 = _seq;
      sVar3 = (*looplimit)(0x10);
      if (sVar3 <= uVar1) break;
      random_read(ptr,(long)malg->keylen);
      random_read(ptr_00,0x100);
      random_read(local_44,4);
      uVar2 = GET_32BIT_MSB_FIRST(local_44);
      log_start();
      key = make_ptrlen(ptr,(long)malg->keylen);
      ssh2_mac_setkey(m_00,key);
      ssh2_mac_generate(m_00,ptr_00,0x100,(ulong)uVar2);
      ssh2_mac_verify(m_00,ptr_00,0x100,(ulong)uVar2);
      log_end();
      _seq = _seq + 1;
    }
    safefree(ptr);
    safefree(ptr_00);
    ssh2_mac_free(m_00);
  }
  return;
}

Assistant:

static void test_mac(const ssh2_macalg *malg)
{
    ssh2_mac *m = ssh2_mac_new(malg, NULL);
    if (!m) {
        test_skipped = true;
        return;
    }

    uint8_t *mkey = snewn(malg->keylen, uint8_t);
    size_t datalen = 256;
    size_t maclen = malg->len;
    uint8_t *data = snewn(datalen + maclen, uint8_t);

    for (size_t i = 0; i < looplimit(16); i++) {
        random_read(mkey, malg->keylen);
        random_read(data, datalen);
        uint8_t seqbuf[4];
        random_read(seqbuf, 4);
        uint32_t seq = GET_32BIT_MSB_FIRST(seqbuf);

        log_start();
        ssh2_mac_setkey(m, make_ptrlen(mkey, malg->keylen));
        ssh2_mac_generate(m, data, datalen, seq);
        ssh2_mac_verify(m, data, datalen, seq);
        log_end();
    }

    sfree(mkey);
    sfree(data);
    ssh2_mac_free(m);
}